

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O1

bool __thiscall
Js::BigUInt::FInitFromDigits<char16_t>(BigUInt *this,char16_t *prgch,int32 cch,int32 *pcchDig)

{
  char16_t *pcVar1;
  char16_t cVar2;
  code *pcVar3;
  int clu;
  bool bVar4;
  undefined4 *puVar5;
  uint32 luAdd;
  uint luMul;
  
  AssertValid(this,true);
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x6f,"(cch >= 0)","cch >= 0");
    if (!bVar4) goto LAB_00698cd5;
    *puVar5 = 0;
  }
  if (prgch == (char16_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x70,"(prgch != 0)","prgch != 0");
    if (!bVar4) goto LAB_00698cd5;
    *puVar5 = 0;
  }
  if (pcchDig == (int32 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x71,"(pcchDig != 0)","pcchDig != 0");
    if (!bVar4) goto LAB_00698cd5;
    *puVar5 = 0;
  }
  clu = (cch + 8) / 9;
  if ((clu <= this->m_cluMax) || (bVar4 = FResize(this,clu), bVar4)) {
    pcVar1 = prgch + cch;
    this->m_clu = 0;
    *pcchDig = cch;
    if (prgch < pcVar1) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      luAdd = 0;
      luMul = 1;
      do {
        cVar2 = *prgch;
        if ((cVar2 == L'_') || (cVar2 == L'.')) {
          *pcchDig = *pcchDig + -1;
        }
        else {
          bVar4 = NumberUtilities::IsDigit((uint)(ushort)cVar2);
          if (!bVar4) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                        ,0x85,"(NumberUtilities::IsDigit(*prgch))",
                                        "NumberUtilities::IsDigit(*prgch)");
            if (!bVar4) goto LAB_00698cd5;
            *puVar5 = 0;
          }
          if (luMul == 1000000000) {
            bVar4 = FMulAdd(this,1000000000,luAdd);
            luMul = 1;
            luAdd = 0;
            if (!bVar4) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar5 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                          ,0x88,"(FMulAdd(luMul, luAdd))","FMulAdd(luMul, luAdd)");
              if (!bVar4) goto LAB_00698cd5;
              *puVar5 = 0;
            }
          }
          luMul = luMul * 10;
          luAdd = ((uint)(ushort)*prgch + luAdd * 10) - 0x30;
        }
        prgch = prgch + 1;
      } while (prgch < pcVar1);
    }
    else {
      luMul = 1;
      luAdd = 0;
    }
    if (luMul < 2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x8f,"(1 < luMul)","1 < luMul");
      if (!bVar4) goto LAB_00698cd5;
      *puVar5 = 0;
    }
    bVar4 = FMulAdd(this,luMul,luAdd);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x90,"(FMulAdd(luMul, luAdd))","FMulAdd(luMul, luAdd)");
      if (!bVar4) {
LAB_00698cd5:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar5 = 0;
    }
    AssertValid(this,true);
    bVar4 = true;
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool BigUInt::FInitFromDigits(const EncodedChar *prgch, int32 cch, int32 *pcchDig)
    {
        AssertBi(this);
        Assert(cch >= 0);
        Assert(prgch != 0);
        Assert(pcchDig != 0);

        uint32 luAdd;
        uint32 luMul;
        int32 clu = (cch + 8) / 9;
        const EncodedChar *pchLim = prgch + cch;

        if (clu > m_cluMax && !FResize(clu))
            return false;
        m_clu = 0;

        luAdd = 0;
        luMul = 1;
        for (*pcchDig = cch; prgch < pchLim; prgch++)
        {
            if (*prgch == '.' || *prgch == '_')
            {
                (*pcchDig)--;
                continue;
            }
            Assert(NumberUtilities::IsDigit(*prgch));
            if (luMul == 1000000000)
            {
                AssertVerify(FMulAdd(luMul, luAdd));
                luMul = 1;
                luAdd = 0;
            }
            luMul *= 10;
            luAdd = luAdd * 10 + *prgch - '0';
        }
        Assert(1 < luMul);
        AssertVerify(FMulAdd(luMul, luAdd));

        AssertBi(this);
        return true;
    }